

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localServer.c
# Opt level: O2

DNSBody * queryFromServer(int socket_handler,DNSQuery *dnsQuery,char *dns_server)

{
  time_t tVar1;
  char *__buf;
  ssize_t sVar2;
  DNSBody *pDVar3;
  socklen_t len;
  undefined8 local_478;
  undefined8 uStack_470;
  DNSQuery *local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  size_t queryLength;
  sockaddr local_438;
  char buf [1024];
  
  local_438.sa_data[6] = '\0';
  local_438.sa_data[7] = '\0';
  local_438.sa_data[8] = '\0';
  local_438.sa_data[9] = '\0';
  local_438.sa_data[10] = '\0';
  local_438.sa_data[0xb] = '\0';
  local_438.sa_data[0xc] = '\0';
  local_438.sa_data[0xd] = '\0';
  local_438.sa_family = 2;
  local_438.sa_data[0] = '\0';
  local_438.sa_data[1] = '5';
  local_438.sa_data._2_4_ = inet_addr(dns_server);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  rand();
  uStack_470 = 0;
  uStack_460 = 0;
  local_458 = 0;
  uStack_450 = 0;
  local_478 = 0x100010000;
  local_468 = dnsQuery;
  __buf = serilizeDNS((DNSBody)ZEXT2448(CONCAT816(dnsQuery,ZEXT816(0x100010000))),&queryLength);
  sVar2 = sendto(socket_handler,__buf,queryLength,0,&local_438,0x10);
  if (sVar2 < 1) {
    perror("Send dns package");
  }
  free(__buf);
  len = 0x10;
  sVar2 = recvfrom(socket_handler,buf,0x400,0,&local_438,&len);
  if ((int)(uint)sVar2 < 1) {
    perror("receive socket");
    pDVar3 = (DNSBody *)0x0;
  }
  else {
    pDVar3 = deserializeDNS(buf,(ulong)((uint)sVar2 & 0x7fffffff));
  }
  return pDVar3;
}

Assistant:

DNSBody *queryFromServer(int socket_handler, DNSQuery *dnsQuery, char *dns_server)
{
    struct sockaddr_in dns_server_address = {};
    dns_server_address.sin_family = AF_INET;
    dns_server_address.sin_port = htons(DNS_PORT);  // DNS 53
    dns_server_address.sin_addr.s_addr = inet_addr(dns_server);

    srand((unsigned int) time(NULL));
    unsigned short usId = (unsigned short) rand();

    int query_length;


    DNSBody query;
    memset(&query, 0, sizeof(DNSBody));
    memset(&query.dnsHeader, 0, sizeof(DNSHeader));

    query.dnsHeader.QR = 0;
    query.dnsHeader.Questions = 1;
    query.dnsHeader.RD = 1;
    query.query = dnsQuery;

    size_t queryLength;
    char *serResponse = serilizeDNS(query, &queryLength);

    if (sendto(socket_handler,
               serResponse,
               queryLength,
               0,
               (struct sockaddr *) &dns_server_address,
               sizeof(dns_server_address)) < 1
            )
    {
        perror("Send dns package");
    }

    free(serResponse);
//    releaseDNS(query);


    //recv
    char buf[BUF_SIZE];

    int ret;
    socklen_t len = sizeof(dns_server_address);
    if ((ret = recvfrom(socket_handler,
                        buf,
                        BUF_SIZE,
                        0,
                        (struct sockaddr *) &dns_server_address,
                        (socklen_t *) &len)) < 1)
    {
        perror("receive socket");
        return NULL;
    }

    return deserializeDNS(buf, ret);


}